

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O1

string * getArticle(string *__return_storage_ptr__,string *word)

{
  int iVar1;
  undefined8 in_RAX;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  char *pcVar3;
  char *pcVar4;
  initializer_list<char> __l;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (getArticle(std::__cxx11::string)::vowels == '\0') {
    iVar1 = __cxa_guard_acquire(&getArticle(std::__cxx11::string)::vowels);
    if (iVar1 != 0) {
      uStack_18 = CONCAT17(0x75,CONCAT43(0x6f696561,(undefined3)uStack_18));
      __l._M_len = 5;
      __l._M_array = (iterator)((long)&uStack_18 + 3);
      std::vector<char,_std::allocator<char>_>::vector
                (&getArticle::vowels,__l,(allocator_type *)((long)&uStack_18 + 2));
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&getArticle::vowels,
                   &__dso_handle);
      __cxa_guard_release(&getArticle(std::__cxx11::string)::vowels);
    }
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(word->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (_Var2._M_current ==
      getArticle::vowels.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar4 = "a";
    pcVar3 = "";
  }
  else {
    pcVar4 = "an";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string getArticle(std::string word) {
  static const std::vector<char> vowels = { 'a', 'e', 'i', 'o', 'u' };
  auto iter = std::find(vowels.begin(), vowels.end(), word[0]);
  if(iter == vowels.end()) { return "a"; }
  return "an";
}